

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypes.h
# Opt level: O0

void __thiscall Diligent::Box::Box(Box *this)

{
  Box *this_local;
  
  this->MinX = 0;
  this->MaxX = 0;
  this->MinY = 0;
  this->MaxY = 0;
  this->MinZ = 0;
  this->MaxZ = 1;
  return;
}

Assistant:

Box() noexcept {}